

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,FunctionCallStmt *stmt)

{
  __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  bool bVar1;
  shared_ptr<kratos::FunctionStmtBlock> *psVar2;
  element_type *this_01;
  __shared_ptr_access<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *this_04;
  element_type *peVar3;
  void *key;
  uint64_t uVar4;
  ulong local_c0 [2];
  uint64_t call_signature;
  uint64_t hash;
  reference local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
  *iter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *var_args;
  shared_ptr<kratos::FunctionCallVar> *var;
  undefined1 local_48 [8];
  string str;
  shared_ptr<kratos::FunctionStmtBlock> func;
  FunctionCallStmt *stmt_local;
  HashVisitor *this_local;
  
  psVar2 = FunctionCallStmt::func(stmt);
  this_00 = (__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)((long)&str.field_2 + 8);
  std::shared_ptr<kratos::FunctionStmtBlock>::shared_ptr
            ((shared_ptr<kratos::FunctionStmtBlock> *)this_00,psVar2);
  this_01 = std::
            __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(this_00);
  FunctionStmtBlock::function_name_abi_cxx11_((string *)local_48,this_01);
  this_02 = (__shared_ptr_access<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)FunctionCallStmt::var(stmt);
  this_03 = std::
            __shared_ptr_access<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_02);
  this_04 = FunctionCallVar::args_abi_cxx11_(this_03);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
           ::begin(this_04);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
            ::end(this_04);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&iter);
    if (!bVar1) break;
    local_88 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
               ::operator*(&__end2);
    peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_88->second);
    (*(peVar3->super_IRNode)._vptr_IRNode[0x1f])(&hash);
    std::__cxx11::string::append((string *)local_48);
    std::__cxx11::string::~string((string *)&hash);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
    ::operator++(&__end2);
  }
  key = (void *)std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  uVar4 = hash_64_fnv1a(key,uVar4);
  call_signature = uVar4 << ((byte)(this->super_IRVisitor).level & 0x3f);
  local_c0[1] = 0xe3779b97f4a7c169;
  local_c0[0] = call_signature ^ 0xe3779b97f4a7c169;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,local_c0);
  std::__cxx11::string::~string((string *)local_48);
  std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::FunctionStmtBlock> *)((long)&str.field_2 + 8));
  return;
}

Assistant:

void visit(FunctionCallStmt* stmt) override {
        // this is to hash the call args and func_def
        auto func = stmt->func();
        auto str = func->function_name();
        auto const& var = stmt->var();
        auto const& var_args = var->args();
        // this is ordered map
        for (auto const& iter : var_args) {
            str.append(iter.second->to_string());
        }
        uint64_t hash = hash_64_fnv1a(str.c_str(), str.size()) << level;
        constexpr uint64_t call_signature = shift_const(0x9e3779b97f4a7c16, 4);
        stmt_hashes_.emplace_back(hash ^ call_signature);
    }